

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O2

void __thiscall
spvtools::utils::IntrusiveList<spvtools::opt::Instruction>::~IntrusiveList
          (IntrusiveList<spvtools::opt::Instruction> *this)

{
  this->_vptr_IntrusiveList = (_func_int **)&PTR__IntrusiveList_00a67e98;
  clear(this);
  opt::Instruction::~Instruction(&this->sentinel_);
  return;
}

Assistant:

IntrusiveList<NodeType>::~IntrusiveList() {
  clear();
}